

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O1

bool verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
               (TSTNode<unsigned_char> *node,size_t depth)

{
  TSTNode<unsigned_char> *pTVar1;
  long lVar2;
  bool bVar3;
  void *in_RAX;
  long lVar4;
  long lVar5;
  TSTNode<unsigned_char> *pTVar6;
  
  do {
    pTVar6 = node;
    pTVar1 = (TSTNode<unsigned_char> *)(pTVar6->buckets)._M_elems[0];
    if (((pTVar6->is_tst).super__Base_bitset<1UL>._M_w & 1) == 0) {
      if (pTVar1 != (TSTNode<unsigned_char> *)0x0) {
        in_RAX = (pTVar1->buckets)._M_elems[0];
        lVar4 = (long)(pTVar1->buckets)._M_elems[1] - (long)in_RAX;
        if (lVar4 != 0) {
          lVar4 = lVar4 >> 3;
          lVar5 = 0;
          do {
            lVar2 = *(long *)((long)in_RAX + lVar5 * 8);
            if (lVar2 == 0) goto LAB_001a51a9;
            if (pTVar6->pivot <= *(byte *)(lVar2 + depth)) {
              __assert_fail("ch < node->pivot",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                            ,0xb7,
                            "bool verify_bucket(TSTNode<CharT> *, size_t) [BucketNum = 0U, BucketT = std::vector<unsigned char *>, CharT = unsigned char]"
                           );
            }
            lVar5 = lVar5 + 1;
          } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
        }
      }
    }
    else {
      bVar3 = verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
                        (pTVar1,depth);
      in_RAX = (void *)(ulong)bVar3;
    }
    pTVar1 = (TSTNode<unsigned_char> *)(pTVar6->buckets)._M_elems[1];
    if (((pTVar6->is_tst).super__Base_bitset<1UL>._M_w & 2) == 0) {
      if (pTVar1 != (TSTNode<unsigned_char> *)0x0) {
        in_RAX = (pTVar1->buckets)._M_elems[0];
        lVar4 = (long)(pTVar1->buckets)._M_elems[1] - (long)in_RAX;
        if (lVar4 != 0) {
          lVar4 = lVar4 >> 3;
          lVar5 = 0;
          do {
            lVar2 = *(long *)((long)in_RAX + lVar5 * 8);
            if (lVar2 == 0) goto LAB_001a51a9;
            if (*(uchar *)(lVar2 + depth) != pTVar6->pivot) {
              __assert_fail("ch == node->pivot",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                            ,0xbd,
                            "bool verify_bucket(TSTNode<CharT> *, size_t) [BucketNum = 1U, BucketT = std::vector<unsigned char *>, CharT = unsigned char]"
                           );
            }
            lVar5 = lVar5 + 1;
          } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
        }
      }
    }
    else {
      bVar3 = verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
                        (pTVar1,depth + 1);
      in_RAX = (void *)(ulong)bVar3;
    }
    node = (TSTNode<unsigned_char> *)(pTVar6->buckets)._M_elems[2];
  } while (((pTVar6->is_tst).super__Base_bitset<1UL>._M_w & 4) != 0);
  if (node != (TSTNode<unsigned_char> *)0x0) {
    in_RAX = (node->buckets)._M_elems[0];
    lVar4 = (long)(node->buckets)._M_elems[1] - (long)in_RAX;
    if (lVar4 != 0) {
      lVar4 = lVar4 >> 3;
      lVar5 = 0;
      do {
        lVar2 = *(long *)((long)in_RAX + lVar5 * 8);
        if (lVar2 == 0) {
LAB_001a51a9:
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                        ,0x26,"unsigned char get_char(unsigned char *, size_t)");
        }
        if (*(byte *)(lVar2 + depth) <= pTVar6->pivot) {
          __assert_fail("ch > node->pivot",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                        ,0xc3,
                        "bool verify_bucket(TSTNode<CharT> *, size_t) [BucketNum = 2U, BucketT = std::vector<unsigned char *>, CharT = unsigned char]"
                       );
        }
        lVar5 = lVar5 + 1;
      } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
    }
  }
  return SUB81(in_RAX,0);
}

Assistant:

static bool
verify_tst(TSTNode<CharT>* node, size_t depth)
{
	if (node->pivot)
		debug() << __func__ << "() pivot=" << node->pivot << " depth=" << depth << '\n';
	else
		debug() << __func__ << "() pivot=" << int(node->pivot) << " depth=" << depth << '\n';
	debug_indent;
	verify_bucket<0, BucketT, CharT>(node, depth);
	verify_bucket<1, BucketT, CharT>(node, depth);
	verify_bucket<2, BucketT, CharT>(node, depth);
	return true;
}